

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O2

int ncnn::binary_op_no_broadcast<ncnn::BinaryOp_x86_functor::binary_op_atan2>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  void *pvVar1;
  void *pvVar2;
  void *pvVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  ulong extraout_RAX;
  float *x;
  long lVar7;
  int iVar8;
  long lVar9;
  float *y;
  long lVar10;
  float fVar11;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  __m128 afVar12;
  binary_op_atan2 op;
  __m128 _p1;
  __m128 _p;
  binary_op_atan2 local_a5;
  uint local_a4;
  Mat *local_a0;
  Mat *local_98;
  Mat *local_90;
  ulong local_88;
  long local_80;
  long local_78;
  ulong local_70;
  void *local_68;
  void *local_60;
  float local_58 [2];
  float afStack_50 [2];
  float local_48 [2];
  float afStack_40 [4];
  
  local_a4 = a->h * a->w * a->d * a->elempack;
  uVar6 = (ulong)local_a4;
  local_70 = 0;
  local_a0 = b;
  local_98 = a;
  local_90 = c;
  local_88 = (ulong)(uint)a->c;
  if (a->c < 1) {
    local_88 = local_70;
  }
  while (local_70 != local_88) {
    pvVar1 = local_98->data;
    pvVar2 = local_a0->data;
    local_80 = local_98->elemsize * local_98->cstep * local_70;
    local_60 = (void *)((long)pvVar1 + local_80);
    local_78 = local_a0->elemsize * local_a0->cstep * local_70;
    lVar9 = local_90->elemsize * local_90->cstep * local_70;
    pvVar3 = local_90->data;
    local_68 = (void *)((long)pvVar2 + local_78);
    lVar7 = 0;
    lVar10 = 0;
    for (iVar8 = 0; uVar5 = local_70, uVar6 = (ulong)(iVar8 + 3U), (int)(iVar8 + 3U) < (int)local_a4
        ; iVar8 = iVar8 + 4) {
      local_48 = *(float (*) [2])((long)local_60 + lVar10);
      afStack_40._0_8_ = *(undefined8 *)((float *)((long)local_60 + lVar10) + 2);
      local_58 = *(float (*) [2])((long)local_68 + lVar10);
      afStack_50 = *(float (*) [2])((float *)((long)local_68 + lVar10) + 2);
      afVar12 = BinaryOp_x86_functor::binary_op_atan2::func_pack4
                          (&local_a5,(__m128 *)local_48,(__m128 *)local_58);
      auVar4._8_4_ = extraout_XMM0_Dc;
      auVar4._0_8_ = afVar12._0_8_;
      auVar4._12_4_ = extraout_XMM0_Dd;
      *(undefined1 (*) [16])((long)pvVar3 + lVar10 + lVar9) = auVar4;
      lVar10 = lVar10 + 0x10;
      lVar7 = lVar7 + 4;
    }
    x = (float *)((long)pvVar1 + local_80 + lVar10);
    y = (float *)((long)pvVar2 + local_78 + lVar10);
    for (; (int)lVar7 < (int)local_a4; lVar7 = lVar7 + 1) {
      fVar11 = BinaryOp_x86_functor::binary_op_atan2::func(&local_a5,x,y);
      *(float *)((long)pvVar3 + lVar7 * 4 + lVar9) = fVar11;
      x = x + 1;
      y = y + 1;
      uVar6 = extraout_RAX;
    }
    local_70 = uVar5 + 1;
  }
  return (int)uVar6;
}

Assistant:

static int binary_op_no_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    const int channels = a.c;
    const int size = a.w * a.h * a.d * a.elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}